

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

void forget_levels(int percent)

{
  xchar xVar1;
  long lVar2;
  int local_818 [2];
  int indices [512];
  xchar this_lev;
  int iStack_10;
  xchar maxl;
  int count;
  int i;
  int percent_local;
  
  if (percent != 0) {
    if ((percent < 1) || (100 < percent)) {
      impossible("forget_levels: bad percent %d",(ulong)(uint)percent);
    }
    else {
      indices[0x1fe]._2_1_ = ledger_no(&u.uz);
      indices[0x1fe]._3_1_ = maxledgerno();
      indices[0x1ff] = 0;
      count = percent;
      for (iStack_10 = 0; iStack_10 <= indices[0x1fe]._3_1_; iStack_10 = iStack_10 + 1) {
        if (((levels[iStack_10] != (level *)0x0) &&
            ((*(uint *)&(levels[iStack_10]->flags).field_0x8 >> 0x16 & 1) == 0)) &&
           (iStack_10 != indices[0x1fe]._2_1_)) {
          xVar1 = ledger_to_dnum((xchar)iStack_10);
          if (xVar1 == dungeon_topology.d_sokoban_dnum) {
            count = count + 2;
          }
          else {
            lVar2 = (long)indices[0x1ff];
            indices[0x1ff] = indices[0x1ff] + 1;
            indices[lVar2 + -2] = iStack_10;
          }
        }
      }
      if (100 < count) {
        count = 100;
      }
      randomize(local_818,indices[0x1ff]);
      indices[0x1ff] = (indices[0x1ff] * count + 0x32) / 100;
      for (iStack_10 = 0; iStack_10 < indices[0x1ff]; iStack_10 = iStack_10 + 1) {
        *(uint *)&(levels[indices[(long)iStack_10 + -2]]->flags).field_0x8 =
             *(uint *)&(levels[indices[(long)iStack_10 + -2]]->flags).field_0x8 & 0xffbfffff |
             0x400000;
        forget_map(levels[indices[(long)iStack_10 + -2]],'\x01');
        forget_traps(levels[indices[(long)iStack_10 + -2]]);
        levels[indices[(long)iStack_10 + -2]]->levname[0] = '\0';
      }
    }
  }
  return;
}

Assistant:

void forget_levels(int percent)
{
	int i, count;
	xchar  maxl, this_lev;
	int indices[MAXLINFO];

	if (percent == 0) return;

	if (percent <= 0 || percent > 100) {
	    impossible("forget_levels: bad percent %d", percent);
	    return;
	}

	this_lev = ledger_no(&u.uz);
	maxl = maxledgerno();

	/* count & save indices of non-forgotten visited levels */
	/* Sokoban levels are pre-mapped for the player, and should stay
	 * so, or they become nearly impossible to solve.  But try to
	 * shift the forgetting elsewhere by fiddling with percent
	 * instead of forgetting fewer levels.
	 */
	for (count = 0, i = 0; i <= maxl; i++)
	    if ((levels[i] && !levels[i]->flags.forgotten) && i != this_lev) {
		if (ledger_to_dnum(i) == sokoban_dnum)
		    percent += 2;
		else
		    indices[count++] = i;
	    }
	
	if (percent > 100) percent = 100;

	randomize(indices, count);

	/* forget first % of randomized indices */
	count = ((count * percent) + 50) / 100;
	for (i = 0; i < count; i++) {
	    levels[indices[i]]->flags.forgotten = TRUE;
	    forget_map(levels[indices[i]], TRUE);
	    forget_traps(levels[indices[i]]);
	    levels[indices[i]]->levname[0] = '\0';
	}
}